

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O0

LPWSTR __thiscall AutoString::GetWideString(AutoString *this,charcount_t *destCount)

{
  charcount_t local_24;
  charcount_t *pcStack_20;
  charcount_t tempDestCount;
  charcount_t *destCount_local;
  AutoString *this_local;
  
  if ((this->data_wide == (LPWSTR)0x0) && (this->data != (char *)0x0)) {
    pcStack_20 = destCount;
    destCount_local = (charcount_t *)this;
    utf8::NarrowStringToWide<utf8::malloc_allocator>
              (this->data,this->length,&this->data_wide,&local_24,(size_t *)0x0);
    if (pcStack_20 != (charcount_t *)0x0) {
      *pcStack_20 = local_24;
    }
    this_local = (AutoString *)this->data_wide;
  }
  else {
    this_local = (AutoString *)this->data_wide;
  }
  return (LPWSTR)this_local;
}

Assistant:

LPWSTR GetWideString(charcount_t* destCount = nullptr)
    {
        if(data_wide || !data)
        {
            return data_wide;
        }
        charcount_t tempDestCount;
        utf8::NarrowStringToWide<utf8::malloc_allocator>(data, length, &data_wide, &tempDestCount);

        if (destCount)
        {
            *destCount = tempDestCount;
        }
        return data_wide;
    }